

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O1

void __thiscall
slang::ast::ExplicitImportSymbol::serializeTo(ExplicitImportSymbol *this,ASTSerializer *serializer)

{
  Symbol *value;
  string_view name;
  string_view name_00;
  
  ASTSerializer::write(serializer,0xc,"isFromExport",(ulong)this->isFromExport);
  importedSymbol(this);
  if (this->package_ != (PackageSymbol *)0x0) {
    name._M_str = "package";
    name._M_len = 7;
    ASTSerializer::writeLink(serializer,name,&this->package_->super_Symbol);
  }
  value = importedSymbol(this);
  if (value != (Symbol *)0x0) {
    name_00._M_str = "import";
    name_00._M_len = 6;
    ASTSerializer::writeLink(serializer,name_00,value);
    return;
  }
  return;
}

Assistant:

void ExplicitImportSymbol::serializeTo(ASTSerializer& serializer) const {
    serializer.write("isFromExport", isFromExport);
    if (auto pkg = package())
        serializer.writeLink("package", *pkg);

    if (auto sym = importedSymbol())
        serializer.writeLink("import", *sym);
}